

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QPodArrayOps<_drmModeModeInfo>::emplace<_drmModeModeInfo_const&>
          (QPodArrayOps<_drmModeModeInfo> *this,qsizetype i,_drmModeModeInfo *args)

{
  _drmModeModeInfo **pp_Var1;
  qsizetype *pqVar2;
  Data *pDVar3;
  qsizetype qVar4;
  _drmModeModeInfo *p_Var5;
  long lVar6;
  long lVar7;
  GrowthPosition where;
  uint32_t *puVar8;
  long in_FS_OFFSET;
  byte bVar9;
  uint32_t local_7c [17];
  long local_38;
  
  bVar9 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QArrayDataPointer<_drmModeModeInfo>).d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
LAB_00112c14:
    lVar6 = 0x11;
    puVar8 = local_7c;
    for (lVar7 = lVar6; lVar7 != 0; lVar7 = lVar7 + -1) {
      *puVar8 = args->clock;
      args = (_drmModeModeInfo *)((long)args + (ulong)bVar9 * -8 + 4);
      puVar8 = puVar8 + (ulong)bVar9 * -2 + 1;
    }
    where = (GrowthPosition)(i == 0 && (this->super_QArrayDataPointer<_drmModeModeInfo>).size != 0);
    QArrayDataPointer<_drmModeModeInfo>::detachAndGrow
              (&this->super_QArrayDataPointer<_drmModeModeInfo>,where,1,(_drmModeModeInfo **)0x0,
               (QArrayDataPointer<_drmModeModeInfo> *)0x0);
    p_Var5 = createHole(this,where,i,1);
    puVar8 = local_7c;
    for (; lVar6 != 0; lVar6 = lVar6 + -1) {
      p_Var5->clock = *puVar8;
      puVar8 = puVar8 + (ulong)bVar9 * -2 + 1;
      p_Var5 = (_drmModeModeInfo *)((long)p_Var5 + (ulong)bVar9 * -8 + 4);
    }
  }
  else {
    if (((this->super_QArrayDataPointer<_drmModeModeInfo>).size == i) &&
       (qVar4 = QArrayDataPointer<_drmModeModeInfo>::freeSpaceAtEnd
                          (&this->super_QArrayDataPointer<_drmModeModeInfo>), qVar4 != 0)) {
      p_Var5 = (this->super_QArrayDataPointer<_drmModeModeInfo>).ptr +
               (this->super_QArrayDataPointer<_drmModeModeInfo>).size;
      for (lVar6 = 0x11; lVar6 != 0; lVar6 = lVar6 + -1) {
        p_Var5->clock = args->clock;
        args = (_drmModeModeInfo *)((long)args + (ulong)bVar9 * -8 + 4);
        p_Var5 = (_drmModeModeInfo *)((long)p_Var5 + (ulong)bVar9 * -8 + 4);
      }
    }
    else {
      if ((i != 0) ||
         (qVar4 = QArrayDataPointer<_drmModeModeInfo>::freeSpaceAtBegin
                            (&this->super_QArrayDataPointer<_drmModeModeInfo>), qVar4 == 0))
      goto LAB_00112c14;
      p_Var5 = (this->super_QArrayDataPointer<_drmModeModeInfo>).ptr + -1;
      for (lVar6 = 0x11; lVar6 != 0; lVar6 = lVar6 + -1) {
        p_Var5->clock = args->clock;
        args = (_drmModeModeInfo *)((long)args + (ulong)bVar9 * -8 + 4);
        p_Var5 = (_drmModeModeInfo *)((long)p_Var5 + (ulong)bVar9 * -8 + 4);
      }
      pp_Var1 = &(this->super_QArrayDataPointer<_drmModeModeInfo>).ptr;
      *pp_Var1 = *pp_Var1 + -1;
    }
    pqVar2 = &(this->super_QArrayDataPointer<_drmModeModeInfo>).size;
    *pqVar2 = *pqVar2 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }